

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O1

UTFstring * __thiscall libebml::UTFstring::operator=(UTFstring *this,wchar_t *_aBuf)

{
  size_t sVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  size_t sVar4;
  long lVar5;
  
  if (this->_Data != (wchar_t *)0x0) {
    operator_delete__(this->_Data);
  }
  if (_aBuf == (wchar_t *)0x0) {
    pwVar2 = (wchar_t *)operator_new__(4);
    this->_Data = pwVar2;
  }
  else {
    sVar1 = 0;
    do {
      sVar4 = sVar1;
      sVar1 = sVar4 + 1;
    } while (_aBuf[sVar4] != L'\0');
    this->_Length = sVar4;
    lVar5 = 0;
    pwVar2 = (wchar_t *)operator_new__(-(ulong)(sVar4 + 1 >> 0x3e != 0) | sVar4 * 4 + 4);
    this->_Data = pwVar2;
    wVar3 = *_aBuf;
    if (wVar3 != L'\0') {
      lVar5 = 0;
      do {
        pwVar2[lVar5] = wVar3;
        wVar3 = _aBuf[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (wVar3 != L'\0');
    }
    pwVar2 = pwVar2 + lVar5;
  }
  *pwVar2 = L'\0';
  UpdateFromUCS2(this);
  return this;
}

Assistant:

UTFstring & UTFstring::operator=(const wchar_t * _aBuf)
{
  delete [] _Data;
  if (_aBuf == NULL) {
    _Data = new wchar_t[1];
    _Data[0] = 0;
    UpdateFromUCS2();
    return *this;
  }

  size_t aLen;
  for (aLen=0; _aBuf[aLen] != 0; aLen++);
  _Length = aLen;
  _Data = new wchar_t[_Length+1];
  for (aLen=0; _aBuf[aLen] != 0; aLen++) {
    _Data[aLen] = _aBuf[aLen];
  }
  _Data[aLen] = 0;
  UpdateFromUCS2();
  return *this;
}